

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall DynamicHistogram<double>::add(DynamicHistogram<double> *this,double value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (this->_enabled != true) {
    return false;
  }
  bVar1 = this->_initialized;
  dVar5 = this->_binMax;
  if ((dVar5 != value) || (NAN(dVar5) || NAN(value))) {
    dVar4 = floor((value - this->_binMin) / this->_binWidth);
    iVar3 = (int)dVar4;
    iVar2 = this->_binCount;
  }
  else {
    iVar2 = this->_binCount;
    iVar3 = iVar2 + -1;
  }
  if (((bVar1 == false) || (iVar3 < 0)) || (iVar2 <= iVar3)) {
    if ((int)((ulong)((long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) <= (this->_cache)._count)
    {
      (*this->_vptr_DynamicHistogram[2])(this);
      dVar5 = this->_binMax;
    }
    if ((dVar5 != value) || (NAN(dVar5) || NAN(value))) {
      dVar5 = floor((value - this->_binMin) / this->_binWidth);
      iVar3 = (int)dVar5;
      iVar2 = this->_binCount;
    }
    else {
      iVar2 = this->_binCount;
      iVar3 = iVar2 + -1;
    }
    if ((iVar3 < 0) || (iVar2 <= iVar3)) {
      FixedSizeCache<double>::add(&this->_cache,value);
      return false;
    }
  }
  add_(this,value);
  return true;
}

Assistant:

bool
    add(T const value)
    {
    
        if (!this->_enabled) return false;

        double dValue = (double) value;

        /* Add new data to cache if histogram is uninitialized or not within its bounds */
        if (!(this->_initialized & this->contains_(dValue)))
        {
            /* If cache is full then merge the cache and the histogram first */
            if (this->_cache.full())
            {
                this->merge();
            }

            /* Update cache if new value is not in merged histogram */
            if (!this->contains_(dValue))
            {
                this->_cache.add(dValue);
                return false;
            }
        }

        /* Add new data to existing histogram */
        this->add_(dValue);

        return true;

    }